

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoder_suite.cpp
# Opt level: O3

void compact_int64_suite::fail_array16_int64_missing_five(void)

{
  value_type input [6];
  decoder decoder;
  undefined4 local_48;
  value local_44;
  uchar local_40 [8];
  decoder local_38;
  
  local_38.input._M_str = local_40;
  local_40[4] = '\"';
  local_40[5] = '3';
  local_40[0] = 0xbe;
  local_40[1] = '\b';
  local_40[2] = '\0';
  local_40[3] = '\x11';
  local_38.input._M_len = 6;
  local_38.current.view._M_len = 0;
  local_38.current.view._M_str = (uchar *)0x0;
  local_38.current.code = end;
  trial::protocol::bintoken::detail::decoder::next(&local_38);
  local_44 = local_38.current.code;
  local_48 = 0;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::bintoken::token::code::value,trial::protocol::bintoken::token::code::value>
            ("decoder.code()","token::code::end",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/decoder_suite.cpp"
             ,0xb34,"void compact_int64_suite::fail_array16_int64_missing_five()",&local_44,
             &local_48);
  return;
}

Assistant:

void fail_array16_int64_missing_five()
{
    const value_type input[] = { token::code::array16_int64, 0x08, 0x00, 0x11, 0x22, 0x33 };
    format::detail::decoder decoder(input);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.code(), token::code::end);
}